

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchPars(int dummy)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  level_info_t *plVar4;
  bool bVar5;
  uint local_38;
  int par;
  int result;
  level_info_t *info;
  char *moredata;
  char mapname [8];
  char *space;
  int dummy_local;
  
  DPrintf(4,"[Pars]\n");
  while( true ) {
    while( true ) {
      iVar1 = GetLine();
      if (iVar1 == 0) {
        return 0;
      }
      if (iVar1 != 1) break;
      Printf("Unknown key in [PARS] section: %s\n",Line1);
    }
    iVar2 = strcasecmp("par",Line1);
    if (iVar2 != 0) break;
    mapname = (char  [8])strchr(Line2,0x20);
    if (mapname == (char  [8])0x0) {
      Printf("Need data after par.\n");
    }
    else {
      *(char *)mapname = '\0';
      do {
        mapname = (char  [8])((long)mapname + 1);
        bVar5 = false;
        if (*(char *)mapname != '\0') {
          iVar1 = isspace((int)*(char *)mapname);
          bVar5 = iVar1 != 0;
        }
      } while (bVar5);
      pcVar3 = strchr((char *)mapname,0x20);
      if (pcVar3 == (char *)0x0) {
        iVar1 = atoi(Line2);
        mysnprintf((char *)&moredata,8,"MAP%02d",(long)iVar1 % 100 & 0xffffffff);
        local_38 = atoi((char *)mapname);
      }
      else {
        mysnprintf((char *)&moredata,8,"E%cM%c",(ulong)(uint)(int)*Line2,
                   (ulong)(uint)(int)*(char *)mapname);
        local_38 = atoi(pcVar3 + 1);
      }
      plVar4 = FindLevelInfo((char *)&moredata,true);
      if (plVar4 == (level_info_t *)0x0) {
        Printf("No map %s\n",&moredata);
      }
      else {
        plVar4->partime = local_38;
        DPrintf(4,"Par for %s changed to %d\n",&moredata,(ulong)local_38);
      }
    }
  }
  return iVar1;
}

Assistant:

static int PatchPars (int dummy)
{
	char *space, mapname[8], *moredata;
	level_info_t *info;
	int result, par;

	DPrintf (DMSG_SPAMMY, "[Pars]\n");

	while ( (result = GetLine()) ) {
		// Argh! .bex doesn't follow the same rules as .deh
		if (result == 1) {
			Printf ("Unknown key in [PARS] section: %s\n", Line1);
			continue;
		}
		if (stricmp ("par", Line1))
			return result;

		space = strchr (Line2, ' ');

		if (!space) {
			Printf ("Need data after par.\n");
			continue;
		}

		*space++ = '\0';

		while (*space && isspace(*space))
			space++;

		moredata = strchr (space, ' ');

		if (moredata) {
			// At least 3 items on this line, must be E?M? format
			mysnprintf (mapname, countof(mapname), "E%cM%c", *Line2, *space);
			par = atoi (moredata + 1);
		} else {
			// Only 2 items, must be MAP?? format
			mysnprintf (mapname, countof(mapname), "MAP%02d", atoi(Line2) % 100);
			par = atoi (space);
		}

		if (!(info = FindLevelInfo (mapname)) ) {
			Printf ("No map %s\n", mapname);
			continue;
		}

		info->partime = par;
		DPrintf (DMSG_SPAMMY, "Par for %s changed to %d\n", mapname, par);
	}
	return result;
}